

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O3

REF_STATUS
ref_dist_collisions(REF_GRID ref_grid,REF_BOOL report,char *filename,REF_INT *n_collisions)

{
  uint uVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  uint uVar5;
  FILE *__s;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  int cell;
  double dVar11;
  REF_LIST collision_node;
  REF_LIST collision_faceid;
  REF_LIST ref_list;
  REF_EDGE ref_edge;
  REF_SEARCH ref_search;
  REF_DBL center [3];
  REF_DBL side1;
  REF_DBL side0;
  REF_DBL vol1;
  REF_DBL vol0;
  REF_INT nodes [27];
  REF_LIST local_1b0;
  REF_LIST local_1a8;
  REF_LIST local_1a0;
  REF_EDGE local_198;
  double local_190;
  REF_SEARCH local_188;
  double local_180;
  REF_BOOL local_174;
  char *local_170;
  double local_168 [3];
  long local_150;
  long local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  uint local_118 [28];
  REF_INT local_a8 [2];
  uint local_a0;
  uint local_9c;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *n_collisions = 0;
  uVar3 = ref_edge_create(&local_198,ref_grid);
  if (uVar3 == 0) {
    uVar3 = ref_search_create(&local_188,ref_cell->n);
    if (uVar3 == 0) {
      local_174 = report;
      local_170 = filename;
      if (0 < ref_cell->max) {
        cell = 0;
        do {
          RVar4 = ref_cell_nodes(ref_cell,cell,(REF_INT *)local_118);
          if (RVar4 == 0) {
            pRVar2 = ref_node->real;
            lVar9 = 0;
            do {
              local_168[lVar9] =
                   (pRVar2[(long)(int)local_118[0] * 0xf + lVar9] +
                    pRVar2[(long)(int)local_118[1] * 0xf + lVar9] +
                   pRVar2[(long)(int)local_118[2] * 0xf + lVar9]) * 0.3333333333333333;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_190 = 0.0;
            lVar9 = 0;
            do {
              lVar7 = (long)(int)local_118[lVar9];
              dVar11 = SQRT((pRVar2[lVar7 * 0xf + 2] - local_168[2]) *
                            (pRVar2[lVar7 * 0xf + 2] - local_168[2]) +
                            (pRVar2[lVar7 * 0xf + 1] - local_168[1]) *
                            (pRVar2[lVar7 * 0xf + 1] - local_168[1]) +
                            (pRVar2[lVar7 * 0xf] - local_168[0]) *
                            (pRVar2[lVar7 * 0xf] - local_168[0]));
              if (local_190 <= dVar11) {
                local_190 = dVar11;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            uVar3 = ref_search_insert(local_188,cell,local_168,local_190 * 1.01);
            if (uVar3 != 0) {
              uVar8 = (ulong)uVar3;
              pcVar10 = "insert";
              uVar6 = 0x84;
              goto LAB_0013ce92;
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      local_180 = local_190;
      uVar3 = ref_list_create(&local_1b0);
      if (uVar3 == 0) {
        uVar3 = ref_list_create(&local_1a8);
        if (uVar3 == 0) {
          uVar3 = ref_list_create(&local_1a0);
          if (uVar3 == 0) {
            pcVar10 = local_170;
            if (0 < local_198->n) {
              lVar9 = 0;
              do {
                local_190 = (double)(lVar9 * 2);
                ref_dist_bounding_sphere2
                          (ref_node,local_198->e2n[lVar9 * 2],local_198->e2n[lVar9 * 2 + 1],
                           local_168,&local_180);
                uVar3 = ref_search_touching(local_188,local_1a0,local_168,local_180 * 1.01);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  pcVar10 = "touch";
                  uVar6 = 0x91;
                  goto LAB_0013ce92;
                }
                local_150 = lVar9;
                if (0 < local_1a0->n) {
                  local_148 = lVar9 * 2 + 1;
                  lVar9 = 0;
LAB_0013cf3d:
                  uVar3 = ref_cell_nodes(ref_cell,local_1a0->value[lVar9],(REF_INT *)local_118);
                  if (uVar3 != 0) {
                    uVar8 = (ulong)uVar3;
                    pcVar10 = "cell nodes";
                    uVar6 = 0x94;
                    goto LAB_0013ce92;
                  }
                  uVar3 = local_198->e2n[(long)local_190];
                  uVar1 = local_198->e2n[local_148];
                  if (((local_118[0] != uVar3) || (local_118[1] != uVar1)) &&
                     ((local_118[1] != uVar3 || (local_118[2] != uVar1)))) {
                    if (((local_118[0] != uVar1 || local_118[1] != uVar3) &&
                        (local_118[0] != uVar1 && local_118[1] != uVar1 || local_118[2] != uVar3))
                       && (local_118[0] != uVar3 || local_118[2] != uVar1)) {
                      local_a0 = local_118[2];
                      local_9c = uVar3;
                      uVar5 = ref_node_tet_vol(ref_node,local_a8,&local_120);
                      if (uVar5 == 0) {
                        local_9c = uVar1;
                        uVar5 = ref_node_tet_vol(ref_node,local_a8,&local_128);
                        if (uVar5 == 0) {
                          if (((0.0 < local_120) && (0.0 < local_128)) ||
                             ((local_120 < 0.0 && (local_128 < 0.0)))) goto LAB_0013cfa3;
                          local_a0 = uVar3;
                          local_9c = uVar1;
                          uVar3 = ref_node_tet_vol(ref_node,local_a8,&local_130);
                          if (uVar3 == 0) {
                            uVar3 = ref_node_tet_vol(ref_node,local_a8,&local_138);
                            if (uVar3 == 0) {
                              uVar3 = ref_node_tet_vol(ref_node,local_a8,&local_140);
                              if (uVar3 == 0) {
                                if ((((local_130 <= 0.0) || (local_138 <= 0.0)) ||
                                    (local_140 <= 0.0)) &&
                                   (((0.0 <= local_130 || (0.0 <= local_138)) || (0.0 <= local_140))
                                   )) goto LAB_0013cfa3;
                                uVar3 = ref_list_push(local_1b0,local_118[0]);
                                if (uVar3 != 0) {
                                  uVar8 = (ulong)uVar3;
                                  pcVar10 = "push node";
                                  uVar6 = 0x9c;
                                  goto LAB_0013ce92;
                                }
                                uVar3 = ref_list_push(local_1a8,local_118[ref_cell->node_per]);
                                uVar8 = (ulong)uVar3;
                                if (uVar3 != 0) {
                                  pcVar10 = "push faceid";
                                  uVar6 = 0x9e;
                                  goto LAB_0013ce92;
                                }
                                *n_collisions = *n_collisions + 1;
                                if (local_174 != 0) {
                                  printf("%f %f %f # self intersection of face %d\n",
                                         ref_node->real[(long)(int)local_118[0] * 0xf],
                                         ref_node->real[(long)(int)local_118[0] * 0xf + 1],
                                         (ulong)local_118[ref_cell->node_per]);
                                }
                                goto LAB_0013cfa3;
                              }
                              uVar8 = (ulong)uVar3;
                              pcVar10 = "side2";
                              uVar6 = 0x46;
                            }
                            else {
                              uVar8 = (ulong)uVar3;
                              pcVar10 = "side1";
                              uVar6 = 0x43;
                            }
                          }
                          else {
                            uVar8 = (ulong)uVar3;
                            pcVar10 = "side0";
                            uVar6 = 0x40;
                          }
                        }
                        else {
                          uVar8 = (ulong)uVar5;
                          pcVar10 = "vol1";
                          uVar6 = 0x37;
                        }
                      }
                      else {
                        uVar8 = (ulong)uVar5;
                        pcVar10 = "vol0";
                        uVar6 = 0x35;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                             ,uVar6,"ref_dist_pierce",uVar8,pcVar10);
                      pcVar10 = "hits?";
                      uVar6 = 0x9a;
                      goto LAB_0013ce92;
                    }
                  }
LAB_0013cfa3:
                  lVar9 = lVar9 + 1;
                  pcVar10 = local_170;
                  if (local_1a0->n <= lVar9) goto LAB_0013d221;
                  goto LAB_0013cf3d;
                }
LAB_0013d221:
                uVar3 = ref_list_erase(local_1a0);
                if (uVar3 != 0) {
                  uVar8 = (ulong)uVar3;
                  pcVar10 = "erase";
                  uVar6 = 0xa9;
                  goto LAB_0013ce92;
                }
                lVar9 = local_150 + 1;
              } while (lVar9 < local_198->n);
            }
            if ((pcVar10 != (char *)0x0) && (0 < *n_collisions)) {
              __s = fopen(pcVar10,"w");
              if (__s == (FILE *)0x0) {
                printf("unable to open %s\n",pcVar10);
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,0xb1,"ref_dist_collisions","unable to open file");
                return 2;
              }
              fwrite("title=\"tecplot refine surface self intersections\"\n",0x32,1,__s);
              fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
              uVar3 = *n_collisions;
              uVar1 = local_1b0->n;
              if (uVar3 != uVar1) {
                pcVar10 = "node miscount";
                uVar6 = 0xb4;
LAB_0013d58f:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                       ,uVar6,"ref_dist_collisions",pcVar10,(long)(int)uVar3,(long)(int)uVar1);
                return 1;
              }
              uVar1 = local_1a8->n;
              if (uVar3 != uVar1) {
                pcVar10 = "faceid miscount";
                uVar6 = 0xb5;
                goto LAB_0013d58f;
              }
              fprintf(__s,"zone t=\"intersect\", i=%d, datapacking=%s\n",(ulong)uVar3,"point");
              if (0 < local_1b0->n) {
                lVar9 = 0;
                do {
                  lVar7 = (long)local_1b0->value[lVar9];
                  pRVar2 = ref_node->real;
                  fprintf(__s,"# intersection %d face id\n%f %f %f\n",pRVar2[lVar7 * 0xf],
                          pRVar2[lVar7 * 0xf + 1],pRVar2[lVar7 * 0xf + 2],
                          (ulong)(uint)local_1a8->value[lVar9]);
                  lVar9 = lVar9 + 1;
                } while (lVar9 < local_1b0->n);
              }
              fclose(__s);
            }
            uVar3 = ref_list_free(local_1a0);
            if (uVar3 == 0) {
              uVar3 = ref_list_free(local_1a8);
              if (uVar3 == 0) {
                uVar3 = ref_list_free(local_1b0);
                if (uVar3 == 0) {
                  uVar3 = ref_search_free(local_188);
                  if (uVar3 == 0) {
                    uVar3 = ref_edge_free(local_198);
                    if (uVar3 == 0) {
                      return 0;
                    }
                    uVar8 = (ulong)uVar3;
                    pcVar10 = "free";
                    uVar6 = 199;
                  }
                  else {
                    uVar8 = (ulong)uVar3;
                    pcVar10 = "free";
                    uVar6 = 0xc6;
                  }
                }
                else {
                  uVar8 = (ulong)uVar3;
                  pcVar10 = "free";
                  uVar6 = 0xc5;
                }
              }
              else {
                uVar8 = (ulong)uVar3;
                pcVar10 = "free";
                uVar6 = 0xc4;
              }
            }
            else {
              uVar8 = (ulong)uVar3;
              pcVar10 = "free";
              uVar6 = 0xc3;
            }
          }
          else {
            uVar8 = (ulong)uVar3;
            pcVar10 = "create list";
            uVar6 = 0x89;
          }
        }
        else {
          uVar8 = (ulong)uVar3;
          pcVar10 = "create faceid list";
          uVar6 = 0x88;
        }
      }
      else {
        uVar8 = (ulong)uVar3;
        pcVar10 = "create node list";
        uVar6 = 0x87;
      }
    }
    else {
      uVar8 = (ulong)uVar3;
      pcVar10 = "create search";
      uVar6 = 0x81;
    }
  }
  else {
    uVar8 = (ulong)uVar3;
    pcVar10 = "create edge";
    uVar6 = 0x80;
  }
LAB_0013ce92:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",uVar6,
         "ref_dist_collisions",uVar8,pcVar10);
  return (REF_STATUS)uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_dist_collisions(REF_GRID ref_grid, REF_BOOL report,
                                       const char *filename,
                                       REF_INT *n_collisions) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT item;
  REF_INT edge;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, scale = 1.01;
  REF_BOOL pierce;
  REF_SEARCH ref_search;
  REF_LIST ref_list, collision_node, collision_faceid;

  *n_collisions = 0;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dist_bounding_sphere3(ref_node, nodes, center, &radius), "b");
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "insert");
  }

  RSS(ref_list_create(&collision_node), "create node list");
  RSS(ref_list_create(&collision_faceid), "create faceid list");
  RSS(ref_list_create(&ref_list), "create list");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_dist_bounding_sphere2(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), center,
                                  &radius),
        "b");
    RSS(ref_search_touching(ref_search, ref_list, center, scale * radius),
        "touch");
    each_ref_list_item(ref_list, item) {
      cell = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      if (ref_dist_exclude(ref_edge_e2n(ref_edge, 0, edge),
                           ref_edge_e2n(ref_edge, 1, edge), nodes))
        continue;
      RSS(ref_dist_pierce(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                          ref_edge_e2n(ref_edge, 1, edge), nodes, &pierce),
          "hits?");
      if (pierce) {
        RSS(ref_list_push(collision_node, nodes[0]), "push node");
        RSS(ref_list_push(collision_faceid, nodes[ref_cell_id_index(ref_cell)]),
            "push faceid");
        (*n_collisions) += 1;
        if (report) {
          printf("%f %f %f # self intersection of face %d\n",
                 ref_node_xyz(ref_node, 0, nodes[0]),
                 ref_node_xyz(ref_node, 1, nodes[0]),
                 ref_node_xyz(ref_node, 2, nodes[0]),
                 nodes[ref_cell_id_index(ref_cell)]);
        }
      }
    }
    RSS(ref_list_erase(ref_list), "erase");
  }

  if (NULL != filename && (*n_collisions) > 0) {
    FILE *file;
    REF_INT faceid, node;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine surface self intersections\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");
    REIS(*n_collisions, ref_list_n(collision_node), "node miscount");
    REIS(*n_collisions, ref_list_n(collision_faceid), "faceid miscount");
    fprintf(file, "zone t=\"intersect\", i=%d, datapacking=%s\n", *n_collisions,
            "point");
    each_ref_list_item(collision_node, item) {
      node = ref_list_value(collision_node, item);
      faceid = ref_list_value(collision_faceid, item);
      fprintf(file, "# intersection %d face id\n%f %f %f\n", faceid,
              ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
              ref_node_xyz(ref_node, 2, node));
    }

    fclose(file);
  }

  RSS(ref_list_free(ref_list), "free");
  RSS(ref_list_free(collision_faceid), "free");
  RSS(ref_list_free(collision_node), "free");
  RSS(ref_search_free(ref_search), "free");
  RSS(ref_edge_free(ref_edge), "free");

  return REF_SUCCESS;
}